

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

bool Internal_UseHatchReadV5(ON_BinaryArchive *archive)

{
  int iVar1;
  ON__INT64 local_30;
  ON__INT64 big_value;
  ON__UINT32 tcode;
  uint archive_opennurbs_version_number;
  uint Feb_26_2016_opennurbs_version_number3;
  uint Feb_26_2016_opennurbs_version_number0;
  ON_BinaryArchive *archive_local;
  
  _Feb_26_2016_opennurbs_version_number3 = archive;
  iVar1 = ON_BinaryArchive::Archive3dmVersion(archive);
  if (iVar1 < 0x3c) {
    archive_local._7_1_ = true;
  }
  else {
    iVar1 = ON_BinaryArchive::Archive3dmVersion(_Feb_26_2016_opennurbs_version_number3);
    if (iVar1 < 0x3d) {
      archive_opennurbs_version_number = 0x8c005ca4;
      tcode = 0x8c005ca7;
      big_value._4_4_ =
           ON_BinaryArchive::ArchiveOpenNURBSVersion(_Feb_26_2016_opennurbs_version_number3);
      if (big_value._4_4_ < 0x8c005ca4) {
        archive_local._7_1_ = true;
      }
      else if ((big_value._4_4_ < 0x8c005ca4) || (0x8c005ca7 < big_value._4_4_)) {
        archive_local._7_1_ = false;
      }
      else {
        big_value._0_4_ = 0;
        local_30 = 0;
        ON_BinaryArchive::PeekAt3dmBigChunkType
                  (_Feb_26_2016_opennurbs_version_number3,(ON__UINT32 *)&big_value,&local_30);
        if ((int)big_value == 0x40008000) {
          archive_local._7_1_ = false;
        }
        else {
          archive_local._7_1_ = true;
        }
      }
    }
    else {
      archive_local._7_1_ = false;
    }
  }
  return archive_local._7_1_;
}

Assistant:

static bool Internal_UseHatchReadV5(
  ON_BinaryArchive& archive
  )
{
  if (archive.Archive3dmVersion() < 60)
    return true;
  if (archive.Archive3dmVersion() > 60)
    return false;
  
  // There are 4 possible Feb 26 version numbers depending on the build system
  // archive.Archive3dmVersion() % 4 = (0=developer,1=windows build system,2 = mac build system, 3=unused)
  const unsigned int Feb_26_2016_opennurbs_version_number0 = 2348833956;
  const unsigned int Feb_26_2016_opennurbs_version_number3 = 2348833956+3; 

  const unsigned int archive_opennurbs_version_number = archive.ArchiveOpenNURBSVersion();

  if (archive_opennurbs_version_number < Feb_26_2016_opennurbs_version_number0)
    return true; // "old" opennurbs hatch code

  if (  archive_opennurbs_version_number >= Feb_26_2016_opennurbs_version_number0
    && archive_opennurbs_version_number <= Feb_26_2016_opennurbs_version_number3
    )
  {
    // new hatch IO code pushed to master branch on Feb 26, 2016.
    // THis clunky test has to be used on files written with the Feb 26, 2016 version of opennurbs source code.
    ON__UINT32 tcode = 0;
    ON__INT64 big_value = 0;
    archive.PeekAt3dmBigChunkType(&tcode, &big_value);
    if (TCODE_ANONYMOUS_CHUNK == tcode)
      return false; // use "new" IO
    return true; // use "old" IO
  }

  // 6.0 or later file created with executable using opennurbs code on Feb 27, 2016 or later
  return false;
}